

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cpp
# Opt level: O0

void __thiscall ncnn::Interp::Interp(Interp *this)

{
  Layer *in_RDI;
  
  Layer::Layer(in_RDI);
  in_RDI->_vptr_Layer = (_func_int **)&PTR__Interp_0201b050;
  std::__cxx11::string::string((string *)&in_RDI[1].userdata);
  in_RDI->one_blob_only = true;
  in_RDI->support_inplace = false;
  return;
}

Assistant:

Interp::Interp()
{
    one_blob_only = true;
    support_inplace = false;
}